

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O3

bool __thiscall IntBounds::IsGreaterThanOrEqualTo(IntBounds *this,Value *value,int offset)

{
  int iVar1;
  ValueInfo *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  int local_48;
  ValueNumber local_44;
  int i;
  ValueRelativeOffset *bound;
  int constantBoundBase;
  
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x156,"(value)","value");
    if (!bVar3) goto LAB_005604cd;
    *puVar6 = 0;
  }
  this_00 = value->valueInfo;
  bound._4_4_ = 0x7fffffff;
  bVar3 = ValueInfo::TryGetIntConstantUpperBound(this_00,(int32 *)((long)&bound + 4),true);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x15b,"(success)","success");
    if (!bVar3) {
LAB_005604cd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  iVar5 = this->constantLowerBound;
  if (offset == 1) {
    if (bound._4_4_ < iVar5) {
      return true;
    }
  }
  else if (offset == 0) {
    if (bound._4_4_ <= iVar5) {
      return true;
    }
  }
  else {
    iVar1 = bound._4_4_ + offset;
    if (offset < 0) {
      if (bound._4_4_ <= iVar1 || iVar1 <= iVar5) {
        return true;
      }
    }
    else if (bound._4_4_ <= iVar1 && iVar1 <= iVar5) {
      return true;
    }
  }
  bVar3 = false;
  bVar4 = ValueInfo::HasIntConstantValue(this_00,false);
  if (!bVar4) {
    local_44 = value->valueNumber;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (&(this->relativeLowerBounds).
                        super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ,&local_44,(ValueRelativeOffset **)&i,&local_48);
    if (bVar3) {
      iVar5 = ValueRelativeOffset::Offset(_i);
      bVar3 = offset <= iVar5;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const Value *const value, const int offset) const
{
    Assert(value);

    ValueInfo const * const valueInfo = value->GetValueInfo();
    int constantBoundBase = INT32_MAX;
    const bool success = valueInfo->TryGetIntConstantUpperBound(&constantBoundBase, true);
    Assert(success);
    if(IsGreaterThanOrEqualTo(constantBoundBase, offset))
        return true;

    if(valueInfo->HasIntConstantValue())
        return false;

    const ValueRelativeOffset *bound;
    return relativeLowerBounds.TryGetReference(value->GetValueNumber(), &bound) && bound->Offset() >= offset;
}